

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_ports_linux.cc
# Opt level: O3

string * read_line(string *__return_storage_ptr__,string *file)

{
  char cVar1;
  string *psVar2;
  ifstream ifs;
  undefined1 auStack_228 [8];
  long local_220 [4];
  byte abStack_200 [488];
  
  std::ifstream::ifstream(local_220,(char *)file,_S_in);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((abStack_200[*(long *)(local_220[0] + -0x18)] & 5) == 0) {
    cVar1 = std::ios::widen((char)auStack_228 + (char)*(long *)(local_220[0] + -0x18) + '\b');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)local_220,(string *)__return_storage_ptr__,cVar1);
  }
  psVar2 = (string *)std::ifstream::~ifstream(local_220);
  return psVar2;
}

Assistant:

string
read_line(const string& file)
{
    ifstream ifs(file.c_str(), ifstream::in);

    string line;

    if(ifs)
    {
        getline(ifs, line);
    }

    return line;
}